

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileTest.cpp
# Opt level: O2

void __thiscall FileTest::Test4(FileTest *this)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  FileTest *pFVar4;
  int i;
  ulong uVar5;
  int j;
  ulong uVar6;
  File f;
  Path p;
  File f2;
  
  JetHead::Path::Path(&p,"tmp4");
  JetHead::Path::touch();
  JetHead::File::File(&f);
  pFVar4 = (FileTest *)&f;
  JetHead::File::open((Path *)pFVar4,(int)&p);
  fillFile(pFVar4,&f);
  JetHead::File::close();
  JetHead::File::open((Path *)&f,(int)&p);
  lVar2 = JetHead::File::mmap();
  if (lVar2 == 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/FileTest.cpp"
               ,0x1c3,"Failed to map file");
  }
  lVar3 = JetHead::File::getLength();
  if (lVar3 != 0x600) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/FileTest.cpp"
               ,0x1c6,"file incorrect length");
  }
  lVar3 = lVar2;
  for (uVar5 = 0; uVar5 != 6; uVar5 = uVar5 + 1) {
    if (uVar5 != *(byte *)(lVar2 + uVar5 * 0x100)) {
      TestCase::TestFailedInternal
                (&this->super_TestCase,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/FileTest.cpp"
                 ,0x1cb,"Failed to validate file data with mmap");
    }
    for (uVar6 = 1; uVar6 != 0x100; uVar6 = uVar6 + 1) {
      if (uVar6 != *(byte *)(lVar3 + uVar6)) {
        TestCase::TestFailedInternal
                  (&this->super_TestCase,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/FileTest.cpp"
                   ,0x1d4,"Failed to validate file data with mmap");
      }
    }
    lVar3 = lVar3 + 0x100;
  }
  *(undefined1 *)(lVar2 + 100) = 5;
  JetHead::File::msync();
  JetHead::File::File(&f2);
  pFVar4 = (FileTest *)&f2;
  JetHead::File::open((Path *)pFVar4,(int)&p);
  bVar1 = validateFile(pFVar4,&f2);
  if (bVar1) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/FileTest.cpp"
               ,0x1e1,"mmap modified file not changed on disk");
  }
  JetHead::File::close();
  JetHead::File::munmap();
  JetHead::File::close();
  lVar2 = JetHead::File::mmap();
  if (lVar2 != 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/FileTest.cpp"
               ,0x1eb,"Calling mmap on closed file worked...");
  }
  JetHead::File::~File(&f2);
  JetHead::File::~File(&f);
  std::__cxx11::string::~string((string *)&p);
  return;
}

Assistant:

void FileTest::Test4()
{
	Path p( "tmp4" );
	p.touch();
	File f;
	
	f.open( p, File::OF_WRITE );

	// fill the file with 1536 bytes of data.	
	fillFile( f );

	f.close();
	
	f.open( p, File::OF_RDWR );

	uint8_t *file_data = f.mmap();
	
	if ( file_data == NULL )
		TestFailed( "Failed to map file" );
		
	if ( f.getLength() != 1536 )
		TestFailed( "file incorrect length" );
		
	for ( int i = 0; i < 6; i++ )
	{
		if ( file_data[ i * 256 ] != i )
			TestFailed( "Failed to validate file data with mmap" );

		LOG_INFO( "byte one good" );
		
		for ( int j = 1; j < 256; j++ )
		{
			if ( file_data[ ( i * 256 ) + j ] != j )
			{
				LOG_INFO( "Failed at byte %d", j );
				TestFailed( "Failed to validate file data with mmap" );
			}
		}
	}
	
	file_data[ 100 ] = 5;
	
	f.msync();

	File f2;
	f2.open( p );
	
	if ( validateFile( f2 ) )
		TestFailed( "mmap modified file not changed on disk" );
	
	f2.close();
	
	f.munmap();
	f.close();

	file_data = f.mmap();
	
	if ( file_data != NULL )
		TestFailed( "Calling mmap on closed file worked..." );
}